

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O0

void __thiscall Chip8::OP_1NNN(Chip8 *this)

{
  ostream *poVar1;
  Chip8 *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"JP 0x0");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->opcode & 0xfff);
  poVar1 = std::operator<<(poVar1,"                 ; Jump to location");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Chip8::OP_1NNN() {
    std::cout << "JP 0x0"  << (opcode & 0x0FFFu) << "                 ; Jump to location" << std::endl;
}